

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_expr.cpp
# Opt level: O0

void Omega_h::anon_unknown_41::promote(LO size,Int dim,any *lhs,any *rhs)

{
  ScopedTimer local_21;
  any *local_20;
  any *rhs_local;
  any *lhs_local;
  Int dim_local;
  LO size_local;
  
  local_20 = rhs;
  rhs_local = lhs;
  lhs_local._0_4_ = dim;
  lhs_local._4_4_ = size;
  ScopedTimer::ScopedTimer(&local_21,"promote(size, dim, lhs, rhs)",(char *)0x0);
  ScopedTimer::~ScopedTimer(&local_21);
  if ((Int)lhs_local == 3) {
    promote<3>(lhs_local._4_4_,rhs_local,local_20);
  }
  else if ((Int)lhs_local == 2) {
    promote<2>(lhs_local._4_4_,rhs_local,local_20);
  }
  else {
    if ((Int)lhs_local != 1) {
      fail("assertion %s failed at %s +%d\n","false",
           "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_expr.cpp"
           ,0x5e);
    }
    promote<1>(lhs_local._4_4_,rhs_local,local_20);
  }
  return;
}

Assistant:

void promote(LO size, Int dim, any& lhs, any& rhs) {
  ScopedTimer("promote(size, dim, lhs, rhs)");
  if (dim == 3)
    promote<3>(size, lhs, rhs);
  else if (dim == 2)
    promote<2>(size, lhs, rhs);
  else if (dim == 1)
    promote<1>(size, lhs, rhs);
  else {
    OMEGA_H_NORETURN();
  }
}